

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t httplib::detail::write_response_line(Stream *strm,int status)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ssize_t sVar4;
  int in_ESI;
  long *in_RDI;
  string s;
  string local_68 [8];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  allocator<char> local_31;
  string local_30 [36];
  int local_c;
  long *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ::std::allocator<char>::~allocator(&local_31);
  std::__cxx11::to_string(in_stack_ffffffffffffffbc);
  ::std::__cxx11::string::operator+=(local_30,local_68);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::operator+=(local_30," ");
  pcVar1 = status_message(local_c);
  ::std::__cxx11::string::operator+=(local_30,pcVar1);
  ::std::__cxx11::string::operator+=(local_30,"\r\n");
  uVar2 = ::std::__cxx11::string::data();
  uVar3 = ::std::__cxx11::string::size();
  sVar4 = (**(code **)(*local_8 + 0x30))(local_8,uVar2,uVar3);
  ::std::__cxx11::string::~string(local_30);
  return sVar4;
}

Assistant:

inline ssize_t write_response_line(Stream &strm, int status) {
  std::string s = "HTTP/1.1 ";
  s += std::to_string(status);
  s += " ";
  s += httplib::status_message(status);
  s += "\r\n";
  return strm.write(s.data(), s.size());
}